

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O3

void __thiscall
Time::runNested(Time *this,unsigned_long_long steps,unsigned_long_long runs,DataCollector *runHelper
               ,ostream *log)

{
  unsigned_long_long uVar1;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> runNumbers;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_58;
  unsigned_long_long local_38;
  
  local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long_long *)0x0;
  local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = 0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
  _M_realloc_insert<unsigned_long_long>(&local_58,(iterator)0x0,&local_38);
  if (runs != 0) {
    uVar1 = 0;
    do {
      *local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
       super__Vector_impl_data._M_start = uVar1;
      if (runHelper != (DataCollector *)0x0) {
        (*(code *)**(undefined8 **)runHelper)(runHelper,&local_58);
      }
      run(this,steps,log,true);
      if (runHelper != (DataCollector *)0x0) {
        (**(code **)(*(long *)runHelper + 8))(runHelper,&local_58);
      }
      uVar1 = uVar1 + 1;
    } while (runs != uVar1);
  }
  if (local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long_long *)0x0) {
    operator_delete(local_58.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Time::runNested( unsigned long long steps, unsigned long long runs, DataCollector *runHelper, ostream &log )
{
	vector<unsigned long long> runNumbers;
	runNumbers.push_back(0);
	for (unsigned long long r=0; r<runs; ++r) {
		runNumbers[0] = r;
		if (runHelper)
			runHelper->beforeRun(runNumbers);
		run(steps, log);
		if (runHelper)
			runHelper->afterRun(runNumbers);
	}
}